

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::BoolValue::_InternalParse(BoolValue *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  char cVar4;
  uint32 res32;
  UnknownFieldSet *unknown;
  byte *p;
  uint res;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_unsigned_long> pVar6;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar5 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar5.first;
        res = pVar5.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
      cVar4 = '\x04';
    }
    else if (res == 8) {
      bVar1 = *p;
      pVar6.second = (long)(char)bVar1;
      pVar6.first = (char *)p;
      local_38 = p + 1;
      if ((long)(char)bVar1 < 0) {
        res32 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
        if ((char)*local_38 < '\0') {
          local_38 = p;
          pVar6 = internal::VarintParseSlow64((char *)p,res32);
        }
        else {
          pVar6.second._0_4_ = res32;
          pVar6.first = (char *)(p + 2);
          pVar6.second._4_4_ = 0;
        }
        local_38 = (byte *)pVar6.first;
      }
      this->value_ = pVar6.second != 0;
      cVar4 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
    else if (res == 0 || (res & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      cVar4 = '\a';
    }
    else {
      pvVar2 = this_00->ptr_;
      if (((ulong)pvVar2 & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
      cVar4 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
  } while (cVar4 == '\x02');
  if (cVar4 == '\x04') {
    local_38 = (byte *)0x0;
  }
  return (char *)local_38;
}

Assistant:

const char* BoolValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // bool value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}